

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O2

ostream * wavingz::zwave_print<unsigned_char*>(ostream *out,uchar *data_begin,uchar *data_end)

{
  value_type_conflict2 vVar1;
  ostream *poVar2;
  ulong uVar3;
  char *pcVar4;
  int i;
  long lVar5;
  uchar *ch;
  byte *pbVar6;
  
  for (pbVar6 = data_begin; pbVar6 != data_end; pbVar6 = pbVar6 + 1) {
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::operator<<(out,0x30);
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)*pbVar6);
    std::operator<<(poVar2,' ');
  }
  std::endl<char,std::char_traits<char>>(out);
  if (data_begin != (uchar *)0x0) {
    uVar3 = (ulong)data_begin[7];
    if ((9 < (ulong)((long)data_end - (long)data_begin) && uVar3 != 0) &&
       (uVar3 <= (ulong)((long)data_end - (long)data_begin))) {
      vVar1 = checksum<unsigned_char*>(data_begin,data_begin + (uVar3 - 1));
      pcVar4 = "[ ] ";
      if (vVar1 == data_begin[(ulong)data_begin[7] - 1]) {
        pcVar4 = "[x] ";
      }
      std::operator<<(out,pcVar4);
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar2 = std::operator<<(out,0x30);
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 2;
      poVar2 = std::operator<<(poVar2,"HomeId: ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,", SourceNodeId: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)data_begin[4]);
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar2 = std::operator<<(poVar2,", FC0: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)data_begin[5]);
      poVar2 = std::operator<<(poVar2,", FC1: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)data_begin[6]);
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar2 = std::operator<<(poVar2,", FC[speed=");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,data_begin[5] >> 4 & 1);
      poVar2 = std::operator<<(poVar2," low_power=");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,data_begin[5] >> 5 & 1);
      poVar2 = std::operator<<(poVar2," ack_request=");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,data_begin[5] >> 6 & 1);
      poVar2 = std::operator<<(poVar2," header_type=");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,data_begin[5] & 0xf);
      poVar2 = std::operator<<(poVar2," beaming_info=");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)(data_begin[6] >> 4));
      poVar2 = std::operator<<(poVar2," seq=");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,data_begin[6] & 0xf);
      poVar2 = std::operator<<(poVar2,"], Length: ");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)data_begin[7]);
      poVar2 = std::operator<<(poVar2,", DestNodeId: ");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)data_begin[8]);
      poVar2 = std::operator<<(poVar2,", CommandClass: ");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)data_begin[9]);
      poVar2 = std::operator<<(poVar2,", Payload: ");
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::operator<<(poVar2,0x30);
      for (lVar5 = 10; lVar5 < (long)((ulong)data_begin[7] - 1); lVar5 = lVar5 + 1) {
        *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 2;
        poVar2 = (ostream *)std::ostream::operator<<(out,(uint)data_begin[lVar5]);
        std::operator<<(poVar2," ");
      }
      return out;
    }
  }
  std::operator<<(out,"[ ] ");
  return out;
}

Assistant:

inline std::ostream&
zwave_print(std::ostream& out, It data_begin, It data_end)
{
    for(auto ch = data_begin; ch != data_end; ++ch)
        out << std::hex << std::setfill('0') << std::setw(2) << (int)*ch << ' ';
    out << std::endl;

    size_t len = data_end - data_begin;
    packet_t& p = *(packet_t*)data_begin;
    if (data_begin == 0 || p.length == 0 || len < sizeof(packet_t) || len < p.length)
    {
        out << "[ ] ";
        return out;
    }
    else if (checksum(data_begin, data_begin + (size_t)p.length - 1) !=
             data_begin[p.length - 1])
    {
        out << "[ ] ";
    }
    else
    {
        out << "[x] ";
    }
    out << std::hex << std::setfill('0') << std::setw(2)
        << "HomeId: " << ((uint32_t)p.home_id3 | p.home_id2 << 8 |
                          p.home_id1 << 16 | p.home_id0 << 24)
        << ", SourceNodeId: " << (int)p.source_node_id << std::hex
        << ", FC0: " << (int)p.fc0 << ", FC1: " << (int)p.fc1 << std::dec
        << ", FC[speed=" << p.frame_control_0.speed
        << " low_power=" << p.frame_control_0.low_power
        << " ack_request=" << p.frame_control_0.ack_request
        << " header_type=" << p.frame_control_0.header_type
        << " beaming_info=" << p.frame_control_1.beaming_info
        << " seq=" << p.frame_control_1.sequence_number
        << "], Length: " << std::dec << (int)p.length
        << ", DestNodeId: " << std::dec << (int)p.dest_node_id
        << ", CommandClass: " << std::hex << (int)p.command_class
        << ", Payload: " << std::hex << std::setfill('0');
    for (int i = sizeof(packet_t); i < p.length - 1; i++) {
        out << std::setw(2) << (int)data_begin[i] << " ";
    }
    return out;
}